

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

size_t drwav__write_u16ne_to_le(drwav *pWav,drwav_uint16 value)

{
  size_t sVar1;
  undefined2 in_SI;
  drwav *in_RDI;
  undefined6 in_stack_ffffffffffffffe8;
  
  if (in_RDI == (drwav *)0x0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0x908,"size_t drwav__write_u16ne_to_le(drwav *, drwav_uint16)");
  }
  if (in_RDI->onWrite == (drwav_write_proc)0x0) {
    __assert_fail("pWav->onWrite != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0x909,"size_t drwav__write_u16ne_to_le(drwav *, drwav_uint16)");
  }
  sVar1 = drwav__write(in_RDI,(void *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),0x16c55d);
  return sVar1;
}

Assistant:

static size_t drwav__write_u16ne_to_le(drwav* pWav, drwav_uint16 value)
{
    DRWAV_ASSERT(pWav          != NULL);
    DRWAV_ASSERT(pWav->onWrite != NULL);

    if (!drwav__is_little_endian()) {
        value = drwav__bswap16(value);
    }

    return drwav__write(pWav, &value, 2);
}